

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

void serial_uxsel_setup(Serial *serial)

{
  size_t sVar1;
  uint local_14;
  int rwx;
  Serial *serial_local;
  
  local_14 = (uint)(serial->inbufsize < 0x1001);
  sVar1 = bufchain_size(&serial->output_data);
  if (sVar1 != 0) {
    local_14 = local_14 | 2;
  }
  uxsel_set(serial->fd,local_14,serial_select_result);
  return;
}

Assistant:

static void serial_uxsel_setup(Serial *serial)
{
    int rwx = 0;

    if (serial->inbufsize <= SERIAL_MAX_BACKLOG)
        rwx |= SELECT_R;
    if (bufchain_size(&serial->output_data))
        rwx |= SELECT_W;               /* might also want to write to it */
    uxsel_set(serial->fd, rwx, serial_select_result);
}